

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O2

void cpprofiler::MessageMarshalling::serialize(vector<char,_std::allocator<char>_> *data,string *s)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  char c;
  char local_29;
  
  serialize(data,(int32_t)s->_M_string_length);
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    local_29 = pcVar1[sVar3];
    std::vector<char,_std::allocator<char>_>::push_back(data,&local_29);
  }
  return;
}

Assistant:

static void serialize(std::vector<char>& data, const std::string& s) {
    serialize(data, static_cast<int32_t>(s.size()));
    for (char c : s) {
      data.push_back(c);
    }
  }